

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::Matchers::Impl::StdString::StartsWith::match(StartsWith *this,string *expr)

{
  long lVar1;
  string local_30;
  
  CasedString::adjustString(&local_30,&this->m_data,expr);
  lVar1 = std::__cxx11::string::find((string *)&local_30,(ulong)&(this->m_data).m_str);
  std::__cxx11::string::~string((string *)&local_30);
  return lVar1 == 0;
}

Assistant:

virtual bool match( std::string const& expr ) const {
                return m_data.adjustString( expr ).find( m_data.m_str ) == 0;
            }